

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

uint32 google::ParseCommandLineFlagsInternal
                 (int *argc,char ***argv,bool remove_flags,bool do_report)

{
  bool bVar1;
  uint32 uVar2;
  undefined1 local_100 [4];
  int r;
  undefined1 local_e0 [48];
  undefined1 local_b0 [32];
  undefined1 local_90 [8];
  CommandLineFlagParser parser;
  FlagRegistry *registry;
  bool do_report_local;
  bool remove_flags_local;
  char ***argv_local;
  int *argc_local;
  
  SetArgv(*argc,*argv);
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_unknown_1::FlagRegistry::GlobalRegistry();
  anon_unknown_1::CommandLineFlagParser::CommandLineFlagParser
            ((CommandLineFlagParser *)local_90,
             (FlagRegistry *)
             parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  anon_unknown_1::FlagRegistry::Lock
            ((FlagRegistry *)
             parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  anon_unknown_1::CommandLineFlagParser::ProcessFlagfileLocked
            ((CommandLineFlagParser *)local_b0,(string *)local_90,
             (FlagSettingMode)fLS::FLAGS_flagfile_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_b0);
  anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
            ((CommandLineFlagParser *)local_e0,(string *)local_90,
             (FlagSettingMode)fLS::FLAGS_fromenv_abi_cxx11_,false);
  std::__cxx11::string::~string((string *)local_e0);
  anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
            ((CommandLineFlagParser *)local_100,(string *)local_90,
             (FlagSettingMode)fLS::FLAGS_tryfromenv_abi_cxx11_,false);
  std::__cxx11::string::~string((string *)local_100);
  anon_unknown_1::FlagRegistry::Unlock
            ((FlagRegistry *)
             parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar2 = anon_unknown_1::CommandLineFlagParser::ParseNewCommandLineFlags
                    ((CommandLineFlagParser *)local_90,argc,argv,remove_flags);
  if (do_report) {
    HandleCommandLineHelpFlags();
  }
  anon_unknown_1::CommandLineFlagParser::ValidateAllFlags((CommandLineFlagParser *)local_90);
  bVar1 = anon_unknown_1::CommandLineFlagParser::ReportErrors((CommandLineFlagParser *)local_90);
  if (!bVar1) {
    anon_unknown_1::CommandLineFlagParser::~CommandLineFlagParser((CommandLineFlagParser *)local_90)
    ;
    return uVar2;
  }
  uVar2 = (*(code *)gflags_exitfunc)(1);
  return uVar2;
}

Assistant:

static uint32 ParseCommandLineFlagsInternal(int* argc, char*** argv,
                                            bool remove_flags, bool do_report) {
  SetArgv(*argc, const_cast<const char**>(*argv));    // save it for later

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  CommandLineFlagParser parser(registry);

  // When we parse the commandline flags, we'll handle --flagfile,
  // --tryfromenv, etc. as we see them (since flag-evaluation order
  // may be important).  But sometimes apps set FLAGS_tryfromenv/etc.
  // manually before calling ParseCommandLineFlags.  We want to evaluate
  // those too, as if they were the first flags on the commandline.
  registry->Lock();
  parser.ProcessFlagfileLocked(FLAGS_flagfile, SET_FLAGS_VALUE);
  // Last arg here indicates whether flag-not-found is a fatal error or not
  parser.ProcessFromenvLocked(FLAGS_fromenv, SET_FLAGS_VALUE, true);
  parser.ProcessFromenvLocked(FLAGS_tryfromenv, SET_FLAGS_VALUE, false);
  registry->Unlock();

  // Now get the flags specified on the commandline
  const int r = parser.ParseNewCommandLineFlags(argc, argv, remove_flags);

  if (do_report)
    HandleCommandLineHelpFlags();   // may cause us to exit on --help, etc.

  // See if any of the unset flags fail their validation checks
  parser.ValidateAllFlags();

  if (parser.ReportErrors())        // may cause us to exit on illegal flags
    gflags_exitfunc(1);
  return r;
}